

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O2

forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> __thiscall
TasGrid::readNodeDataList<TasGrid::IO::mode_ascii_type>
          (TasGrid *this,istream *is,size_t num_dimensions,size_t num_outputs)

{
  int iVar1;
  size_t num_entries;
  int iVar2;
  bool bVar3;
  NodeData local_60;
  
  *(undefined8 *)this = 0;
  num_entries = num_outputs;
  iVar1 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(is);
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
              (&local_60.point,(IO *)is,(istream *)num_dimensions,num_entries);
    IO::readVector<TasGrid::IO::mode_ascii_type,double,unsigned_long>
              (&local_60.value,(IO *)is,(istream *)num_outputs,num_entries);
    ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::
    emplace_front<TasGrid::NodeData>
              ((forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)this,&local_60
              );
    NodeData::~NodeData(&local_60);
  }
  return (_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>)
         (_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>)this;
}

Assistant:

std::forward_list<NodeData> readNodeDataList(std::istream &is, size_t num_dimensions, size_t num_outputs){
    std::forward_list<NodeData> data;
    int num_nodes = IO::readNumber<iomode, int>(is);

    for(int i=0; i<num_nodes; i++){
        data.emplace_front(NodeData{
                            IO::readVector<iomode, int>(is, num_dimensions), // point
                            IO::readVector<iomode, double>(is, num_outputs)  // value
                           });
    }

    return data;
}